

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O0

void P_SetSectorFriction(int tag,int amount,bool alterFlag)

{
  int iVar1;
  double friction_00;
  FSectorTagIterator local_30;
  FSectorTagIterator itr;
  double movefactor;
  double friction;
  int s;
  bool alterFlag_local;
  int amount_local;
  int tag_local;
  
  friction_00 = clamp<double>((double)((amount * 0x1eb8) / 0x80 + 0xd001) / 65536.0,0.0,1.0);
  itr = (FSectorTagIterator)FrictionToMoveFactor(friction_00);
  FSectorTagIterator::FSectorTagIterator(&local_30,tag);
  while (iVar1 = FSectorTagIterator::Next(&local_30), -1 < iVar1) {
    sectors[iVar1].friction = friction_00;
    sectors[iVar1].movefactor = (double)itr;
    if (alterFlag) {
      if ((friction_00 != 0.90625) || (NAN(friction_00))) {
        sectors[iVar1].Flags = sectors[iVar1].Flags | 0x10;
      }
      else {
        sectors[iVar1].Flags = sectors[iVar1].Flags & 0xffffffef;
      }
    }
  }
  return;
}

Assistant:

void P_SetSectorFriction (int tag, int amount, bool alterFlag)
{
	int s;
	double friction, movefactor;

	// An amount of 100 should result in a friction of
	// ORIG_FRICTION (0xE800)
	friction = ((0x1EB8 * amount) / 0x80 + 0xD001) / 65536.;

	// killough 8/28/98: prevent odd situations
	friction = clamp(friction, 0., 1.);

	// The following check might seem odd. At the time of movement,
	// the move distance is multiplied by 'friction/0x10000', so a
	// higher friction value actually means 'less friction'.
	movefactor = FrictionToMoveFactor(friction);

	FSectorTagIterator itr(tag);
	while ((s = itr.Next()) >= 0)
	{
		// killough 8/28/98:
		//
		// Instead of spawning thinkers, which are slow and expensive,
		// modify the sector's own friction values. Friction should be
		// a property of sectors, not objects which reside inside them.
		// Original code scanned every object in every friction sector
		// on every tic, adjusting its friction, putting unnecessary
		// drag on CPU. New code adjusts friction of sector only once
		// at level startup, and then uses this friction value.

		sectors[s].friction = friction;
		sectors[s].movefactor = movefactor;
		if (alterFlag)
		{
			// When used inside a script, the sectors' friction flags
			// can be enabled and disabled at will.
			if (friction == ORIG_FRICTION)
			{
				sectors[s].Flags &= ~SECF_FRICTION;
			}
			else
			{
				sectors[s].Flags |= SECF_FRICTION;
			}
		}
	}
}